

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::GetData
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  __pthread_internal_list **this_00;
  GlobalSourceState *pGVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  pointer pIVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer __p;
  pointer pGVar6;
  pointer pGVar7;
  reference this_01;
  pointer pSVar8;
  type args;
  Allocator *allocator;
  pointer this_02;
  const_reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  reference other;
  idx_t col_idx;
  size_type sVar12;
  idx_t iVar13;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_03;
  idx_t count;
  idx_t col_idx_1;
  bool bVar14;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  
  pGVar6 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pGVar1 = input->global_state;
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar1 + 1))->__data);
  this_00 = &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
  if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
      == (__pthread_internal_list *)0x0) {
    pGVar7 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)(pGVar6 + 1));
    if ((pGVar7->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar7->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar14 = true;
      goto LAB_009bc671;
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::get<true>(&(pGVar7->global_sort_state).sorted_blocks,0);
    pSVar8 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(this_01);
    args = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator*
                     (&pSVar8->payload_data);
    make_uniq<duckdb::PayloadScanner,duckdb::SortedData&,duckdb::GlobalSortState&>
              ((duckdb *)&rhs_chunk,args,&pGVar7->global_sort_state);
    __p = rhs_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start;
    rhs_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
    reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
          this_00,(pointer)__p);
    ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
    ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
                &rhs_chunk);
  }
  pGVar7 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar6 + 1));
  _Var2._M_head_impl =
       (pGVar7->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  DataChunk::DataChunk(&rhs_chunk);
  allocator = Allocator::Get(context->client);
  pGVar7 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar6 + 1));
  DataChunk::Initialize
            (&rhs_chunk,allocator,&(pGVar7->global_sort_state).payload_layout.types,0x800);
  SelectionVector::SelectionVector(&rsel,0x800);
  do {
    this_02 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
              ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                            *)this_00);
    PayloadScanner::Scan(this_02,&rhs_chunk);
    if (rhs_chunk.count == 0) {
      bVar14 = result->count == 0;
      goto LAB_009bc65d;
    }
    pIVar3 = pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_start;
    count = 0;
    for (iVar13 = 0; rhs_chunk.count != iVar13; iVar13 = iVar13 + 1) {
      if ((_Var2._M_head_impl + (long)pIVar3)[iVar13] == false) {
        rsel.sel_vector[count] = (sel_t)iVar13;
        count = count + 1;
      }
    }
    pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
    super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)&pIVar3->mode + rhs_chunk.count);
  } while (count == 0);
  this_03 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
             super_CachingPhysicalOperator.super_PhysicalOperator.children;
  pvVar9 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_03,0);
  sVar10 = ((long)(pvVar9->_M_data->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar9->_M_data->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
  for (sVar12 = 0; sVar10 != sVar12; sVar12 = sVar12 + 1) {
    pvVar11 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar12);
    Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
    pvVar11 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar12);
    ConstantVector::SetNull(pvVar11,true);
  }
  pvVar9 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_03,1);
  pLVar4 = (pvVar9->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar5 = (pvVar9->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar12 = 0; ((long)pLVar4 - (long)pLVar5) / 0x18 != sVar12; sVar12 = sVar12 + 1) {
    pvVar11 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar10 + sVar12);
    other = vector<duckdb::Vector,_true>::get<true>(&rhs_chunk.data,sVar12);
    Vector::Slice(pvVar11,other,&rsel,count);
  }
  result->count = count;
  bVar14 = false;
LAB_009bc65d:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rsel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  DataChunk::~DataChunk(&rhs_chunk);
LAB_009bc671:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return bVar14;
}

Assistant:

SourceResultType PhysicalPiecewiseMergeJoin::GetData(ExecutionContext &context, DataChunk &result,
                                                     OperatorSourceInput &input) const {
	D_ASSERT(PropagatesBuildSide(join_type));
	// check if we need to scan any unmatched tuples from the RHS for the full/right outer join
	auto &sink = sink_state->Cast<MergeJoinGlobalState>();
	auto &state = input.global_state.Cast<PiecewiseJoinScanState>();

	lock_guard<mutex> l(state.lock);
	if (!state.scanner) {
		// Initialize scanner (if not yet initialized)
		auto &sort_state = sink.table->global_sort_state;
		if (sort_state.sorted_blocks.empty()) {
			return SourceResultType::FINISHED;
		}
		state.scanner = make_uniq<PayloadScanner>(*sort_state.sorted_blocks[0]->payload_data, sort_state);
	}

	// if the LHS is exhausted in a FULL/RIGHT OUTER JOIN, we scan the found_match for any chunks we
	// still need to output
	const auto found_match = sink.table->found_match.get();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), sink.table->global_sort_state.payload_layout.GetTypes());
	SelectionVector rsel(STANDARD_VECTOR_SIZE);
	for (;;) {
		// Read the next sorted chunk
		state.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
		}

		idx_t result_count = 0;
		// figure out which tuples didn't find a match in the RHS
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[state.right_outer_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}
		state.right_outer_position += count;

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				result.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result.data[col_idx], true);
			}
			const idx_t right_column_count = children[1].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < right_column_count; ++col_idx) {
				result.data[left_column_count + col_idx].Slice(rhs_chunk.data[col_idx], rsel, result_count);
			}
			result.SetCardinality(result_count);
			break;
		}
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}